

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

bool am_active_if_need_object_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40 [3];
  Am_Object local_28;
  int local_1c;
  Am_Object *pAStack_18;
  int val;
  Am_Object *self_local;
  
  pAStack_18 = self;
  Am_Object::Get_Sibling(&local_28,(Am_Slot_Key)self,(ulong)Am_CHANGE_LEFT);
  pAVar2 = Am_Object::Get(&local_28,0x169,0);
  bVar1 = Am_Value::Valid(pAVar2);
  Am_Object::~Am_Object(&local_28);
  if (bVar1) {
    Am_Object::Get_Sibling(local_40,(Am_Slot_Key)pAStack_18,(ulong)Am_LEFT_HOW);
    pAVar2 = Am_Object::Get(local_40,0x169,0);
    local_1c = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::~Am_Object(local_40);
    if ((0xb < local_1c) && (local_1c < 100)) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_48,(Am_Slot_Key)pAStack_18,(ulong)Am_CHANGE_TOP);
  pAVar2 = Am_Object::Get(&local_48,0x169,0);
  bVar1 = Am_Value::Valid(pAVar2);
  Am_Object::~Am_Object(&local_48);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_50,(Am_Slot_Key)pAStack_18,(ulong)Am_TOP_HOW);
    pAVar2 = Am_Object::Get(&local_50,0x169,0);
    local_1c = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::~Am_Object(&local_50);
    if ((0xb < local_1c) && (local_1c < 100)) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_58,(Am_Slot_Key)pAStack_18,(ulong)Am_CHANGE_WIDTH);
  pAVar2 = Am_Object::Get(&local_58,0x169,0);
  bVar1 = Am_Value::Valid(pAVar2);
  Am_Object::~Am_Object(&local_58);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_60,(Am_Slot_Key)pAStack_18,(ulong)Am_WIDTH_HOW);
    pAVar2 = Am_Object::Get(&local_60,0x169,0);
    local_1c = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::~Am_Object(&local_60);
    if ((0xb < local_1c) && (local_1c < 100)) {
      return true;
    }
  }
  Am_Object::Get_Sibling(&local_68,(Am_Slot_Key)pAStack_18,(ulong)Am_CHANGE_HEIGHT);
  pAVar2 = Am_Object::Get(&local_68,0x169,0);
  bVar1 = Am_Value::Valid(pAVar2);
  Am_Object::~Am_Object(&local_68);
  if (bVar1) {
    Am_Object::Get_Sibling(&local_70,(Am_Slot_Key)pAStack_18,(ulong)Am_HEIGHT_HOW);
    pAVar2 = Am_Object::Get(&local_70,0x169,0);
    local_1c = Am_Value::operator_cast_to_int(pAVar2);
    Am_Object::~Am_Object(&local_70);
    if ((0xb < local_1c) && (local_1c < 100)) {
      return true;
    }
  }
  return false;
}

Assistant:

Am_Define_Formula(bool, am_active_if_need_object)
{
  int val;
  if (self.Get_Sibling(Am_CHANGE_LEFT).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_LEFT_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_TOP).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_TOP_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_WIDTH).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_WIDTH_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  if (self.Get_Sibling(Am_CHANGE_HEIGHT).Get(Am_VALUE).Valid()) {
    val = self.Get_Sibling(Am_HEIGHT_HOW).Get(Am_VALUE);
    if (val >= am_change_offset_left_outside && val < am_ask_user_base)
      return true;
  }

  return false;
}